

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Emulator.cpp
# Opt level: O2

void mainLoop(void)

{
  Console *this;
  
  this = Console::Instance();
  while (isRunning == '\x01') {
    Console::frame(this);
  }
  return;
}

Assistant:

void mainLoop() {
    Console &c = Console::Instance();

#ifdef __EMSCRIPTEN__
    c.getCPU()->execute();
    c.getCPU()->execute();
#endif

    while (isRunning) {
	    c.frame();
    }
}